

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVec.cpp
# Opt level: O2

void __thiscall FeatureVec::FeatureVec(FeatureVec *this,size_t num_features,float initial_value)

{
  undefined1 auVar1 [16];
  allocator_type local_2d;
  float local_2c;
  _Vector_base<float,_std::allocator<float>_> local_28;
  
  auVar1._0_12_ = ZEXT812(0);
  auVar1._12_4_ = 0;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar1._0_8_;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)auVar1._8_8_;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2c = initial_value;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_28,num_features,&local_2c,&local_2d);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&this->values,&local_28);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

FeatureVec::FeatureVec(size_t num_features, float initial_value) {
  values = std::vector<float>(num_features, initial_value);
}